

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O0

bool __thiscall QWidgetLineControl::fixup(QWidgetLineControl *this)

{
  long lVar1;
  ulong uVar2;
  undefined1 *puVar3;
  bool bVar4;
  int iVar5;
  QValidator *pQVar6;
  QString *in_RDI;
  long in_FS_OFFSET;
  int cursorCopy;
  QString textCopy;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  byte local_25;
  int local_24;
  undefined1 local_20 [3];
  QString *txt;
  QWidgetLineControl *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = ::QPointer::operator_cast_to_bool((QPointer<QValidator> *)0x5dcc81);
  if (bVar4) {
    _local_20 = &DAT_aaaaaaaaaaaaaaaa;
    txt = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = (QWidgetLineControl *)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString(in_RDI,(QString *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8)
                    );
    local_24 = (int)in_RDI[2].d.size;
    pQVar6 = QPointer<QValidator>::operator->((QPointer<QValidator> *)0x5dccd9);
    (**(code **)(*(long *)pQVar6 + 0x68))(pQVar6,local_20);
    pQVar6 = QPointer<QValidator>::operator->((QPointer<QValidator> *)0x5dccf8);
    iVar5 = (**(code **)(*(long *)pQVar6 + 0x60))(pQVar6,local_20,&local_24);
    if (iVar5 == 2) {
      bVar4 = ::operator!=(in_RDI,(QString *)
                                  CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
      puVar3 = _local_20;
      if ((bVar4) || (local_24 != (int)in_RDI[2].d.size)) {
        uVar2 = (ulong)_local_20 >> 0x20;
        iVar5 = (int)uVar2;
        bVar4 = SUB81((ulong)puVar3 >> 0x18,0);
        _local_20 = puVar3;
        internalSetText(this_00,txt,iVar5,bVar4);
      }
      local_25 = 1;
      bVar4 = true;
    }
    else {
      bVar4 = false;
    }
    QString::~QString((QString *)0x5dcd6b);
    if (bVar4) goto LAB_005dcd7e;
  }
  local_25 = 0;
LAB_005dcd7e:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(local_25 & 1);
}

Assistant:

bool QWidgetLineControl::fixup() // this function assumes that validate currently returns != Acceptable
{
#ifndef QT_NO_VALIDATOR
    if (m_validator) {
        QString textCopy = m_text;
        int cursorCopy = m_cursor;
        m_validator->fixup(textCopy);
        if (m_validator->validate(textCopy, cursorCopy) == QValidator::Acceptable) {
            if (textCopy != m_text || cursorCopy != m_cursor)
                internalSetText(textCopy, cursorCopy, false);
            return true;
        }
    }
#endif
    return false;
}